

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

store * store_home(player *p)

{
  town *ptVar1;
  store *psVar2;
  long lVar3;
  town *ptVar4;
  
  if (((player->opts).opt[0x2b] == true) && (p->home == 0)) {
    return (store *)0x0;
  }
  lVar3 = (long)world->num_towns;
  if (0 < lVar3) {
    ptVar4 = world->towns;
    ptVar1 = (town *)0x0;
    do {
      if (ptVar4->index == (int)p->home) {
        ptVar1 = ptVar4;
      }
      ptVar4 = ptVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if (ptVar1 != (town *)0x0) {
      psVar2 = (store *)&ptVar1->stores;
      do {
        psVar2 = psVar2->next;
        if (psVar2 == (store *)0x0) {
          return (store *)0x0;
        }
      } while (psVar2->sidx != store_home_idx);
      return psVar2;
    }
  }
  __assert_fail("hometown",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                ,0x266,"struct store *store_home(struct player *)");
}

Assistant:

struct store *store_home(struct player *p)
{
	struct store *store;
	int i;
	struct town *hometown = NULL;

	if (OPT(player, birth_thrall) && !p->home) return NULL; 

	for (i = 0; i < world->num_towns; i++) {
		if (world->towns[i].index == p->home) {
			hometown = &world->towns[i];
		}
	}
	assert(hometown);

	store = hometown->stores;
	while (store) {
		if (store->sidx == store_home_idx) break;
		store = store->next;
	}
	return store;
}